

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O2

int tnt_reply_body0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  char *local_98;
  char *test;
  tnt_reply *local_88;
  byte *local_80;
  byte *local_78;
  byte *local_70;
  char *local_68;
  byte *local_60;
  byte *local_58;
  byte *local_50;
  char *local_48;
  uint32_t local_3c;
  byte *pbStack_38;
  uint32_t elen;
  char *p;
  
  local_98 = buf;
  pbStack_38 = (byte *)buf;
  iVar1 = mp_check(&local_98,buf + size);
  iVar4 = -1;
  if ((iVar1 == 0) && (mp_type_hint[(byte)*buf] == MP_MAP)) {
    test = (char *)off;
    local_88 = r;
    uVar2 = mp_decode_map((char **)&stack0xffffffffffffffc8);
    local_68 = (char *)0x0;
    local_48 = (char *)0x0;
    local_80 = (byte *)0x0;
    local_60 = (byte *)0x0;
    local_78 = (byte *)0x0;
    local_58 = (byte *)0x0;
    local_70 = (byte *)0x0;
    local_50 = (byte *)0x0;
    uVar5 = 0;
    while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
      uVar3 = mp_decode_uint((char **)&stack0xffffffffffffffc8);
      iVar4 = (int)uVar3;
      if (iVar4 == 0x30) {
        local_80 = pbStack_38;
        if (mp_type_hint[*pbStack_38] != MP_ARRAY) {
          return -1;
        }
        mp_next((char **)&stack0xffffffffffffffc8);
        local_60 = pbStack_38;
      }
      else if (iVar4 == 0x42) {
        local_70 = pbStack_38;
        if (mp_type_hint[*pbStack_38] != MP_MAP) {
          return -1;
        }
        mp_next((char **)&stack0xffffffffffffffc8);
        local_50 = pbStack_38;
      }
      else if (iVar4 == 0x32) {
        local_78 = pbStack_38;
        if (mp_type_hint[*pbStack_38] != MP_ARRAY) {
          return -1;
        }
        mp_next((char **)&stack0xffffffffffffffc8);
        local_58 = pbStack_38;
      }
      else if (iVar4 == 0x31) {
        if (mp_type_hint[*pbStack_38] != MP_STR) {
          return -1;
        }
        local_3c = 0;
        local_68 = mp_decode_str((char **)&stack0xffffffffffffffc8,&local_3c);
        local_48 = local_68 + local_3c;
      }
      else {
        mp_next((char **)&stack0xffffffffffffffc8);
      }
      uVar5 = uVar5 | 1L << (uVar3 & 0x3f);
    }
    if (local_88 != (tnt_reply *)0x0) {
      local_88->error = local_68;
      local_88->error_end = local_48;
      local_88->data = (char *)local_80;
      local_88->data_end = (char *)local_60;
      local_88->metadata = (char *)local_78;
      local_88->metadata_end = (char *)local_58;
      local_88->sqlinfo = (char *)local_70;
      local_88->sqlinfo_end = (char *)local_50;
      local_88->bitmap = local_88->bitmap | uVar5;
    }
    iVar4 = 0;
    if (test != (char *)0x0) {
      *(long *)test = (long)pbStack_38 - (long)buf;
    }
  }
  return iVar4;
}

Assistant:

int
tnt_reply_body0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;
	const char *error = NULL, *error_end = NULL,
		   *data = NULL, *data_end = NULL,
		   *metadata = NULL, *metadata_end = NULL,
		   *sqlinfo = NULL, *sqlinfo_end = NULL;
	uint64_t bitmap = 0;
	uint32_t n = mp_decode_map(&p);
	while (n-- > 0) {
		uint32_t key = mp_decode_uint(&p);
		switch (key) {
		case TNT_ERROR: {
			if (mp_typeof(*p) != MP_STR)
				return -1;
			uint32_t elen = 0;
			error = mp_decode_str(&p, &elen);
			error_end = error + elen;
			break;
		}
		case TNT_DATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			data = p;
			mp_next(&p);
			data_end = p;
			break;
		}
		case TNT_METADATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			metadata = p;
			mp_next(&p);
			metadata_end = p;
			break;
		}
		case TNT_SQL_INFO: {
			if (mp_typeof(*p) != MP_MAP)
				return -1;
			sqlinfo = p;
			mp_next(&p);
			sqlinfo_end = p;
			break;
		}
		default: {
			mp_next(&p);
			break;
		}
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->error = error;
		r->error_end = error_end;
		r->data = data;
		r->data_end = data_end;
		r->metadata = metadata;
		r->metadata_end = metadata_end;
		r->sqlinfo = sqlinfo;
		r->sqlinfo_end = sqlinfo_end;
		r->bitmap |= bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}